

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

void commit_v(uint8_t *digest,uint8_t *input,msgs_t *msgs,picnic_instance_t *params)

{
  long in_RCX;
  long in_RDX;
  size_t i;
  hash_context ctx;
  uint8_t *in_stack_fffffffffffffee8;
  hash_context *in_stack_fffffffffffffef0;
  undefined8 local_108;
  
  hash_init(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
  hash_update(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0x1471cf);
  for (local_108 = 0; local_108 < *(byte *)(in_RCX + 0xb); local_108 = local_108 + 1) {
    in_stack_fffffffffffffef0 = *(hash_context **)(in_RDX + local_108 * 8);
    numBytes((uint32_t)*(undefined8 *)(in_RDX + 0x80));
    hash_update(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0x14722d);
  }
  hash_final((hash_context *)0x147247);
  hash_squeeze(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0x147267);
  return;
}

Assistant:

static void commit_v(uint8_t* digest, const uint8_t* input, const msgs_t* msgs,
                     const picnic_instance_t* params) {
  hash_context ctx;

  hash_init(&ctx, params->digest_size);
  hash_update(&ctx, input, params->input_output_size);
  for (size_t i = 0; i < params->num_MPC_parties; i++) {
    hash_update(&ctx, msgs->msgs[i], numBytes(msgs->pos));
  }
  hash_final(&ctx);
  hash_squeeze(&ctx, digest, params->digest_size);
  hash_clear(&ctx);
}